

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IncDecVerify.cpp
# Opt level: O1

void incdec_verify::PostIncTestUint64(void)

{
  bool expected;
  unsigned_long t;
  long lVar1;
  string local_50;
  
  lVar1 = 0x10;
  do {
    t = *(unsigned_long *)(&UNK_0014d530 + lVar1);
    if (t == 0xffffffffffffffff) {
      safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>::SafeIntOnOverflow();
    }
    expected = *(bool *)((long)&inc_uint64 + lVar1);
    if (expected != true) {
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_50,"Error in case inc_uint64 throw (2): ","");
      err_msg<unsigned_long>(&local_50,t,expected);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
    }
    lVar1 = lVar1 + 0x18;
  } while (lVar1 != 0x1a8);
  return;
}

Assistant:

void PostIncTestUint64()
{
	size_t i;

	for( i = 0; i < COUNTOF(inc_uint64); ++i )
	{
		bool fSuccess = true;
		try
		{
			SafeInt<std::uint64_t> si(inc_uint64[i].x);
			SafeInt<std::uint64_t> vv = si++;

			if(vv != inc_uint64[i].x)
			{
				fSuccess = false;
			}
		}
		catch(SafeIntException&)
		{
			fSuccess = false;
		}

		if( fSuccess != inc_uint64[i].fExpected )
		{
			err_msg( "Error in case inc_uint64 throw (2): ",
			inc_uint64[i].x,
			inc_uint64[i].fExpected );
		}
	}
}